

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O0

void __thiscall
glslang::HlslParseContext::handlePragma
          (HlslParseContext *this,TSourceLoc *loc,
          TVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>
          *tokens)

{
  bool bVar1;
  size_type sVar2;
  pointer pbVar3;
  iterator __first;
  iterator __last;
  iterator __result;
  reference pvVar4;
  const_reference pvVar5;
  char *pcVar6;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>_>
  local_50;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>_>
  local_48;
  iterator it;
  TVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>
  lowerTokens;
  TVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>
  *tokens_local;
  TSourceLoc *loc_local;
  HlslParseContext *this_local;
  
  bVar1 = std::function::operator_cast_to_bool
                    ((function *)&(this->super_TParseContextBase).pragmaCallback);
  if (bVar1) {
    std::
    function<void_(int,_const_glslang::TVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_&)>
    ::operator()(&(this->super_TParseContextBase).pragmaCallback,loc->line,tokens);
  }
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
          ::size(&tokens->
                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
                );
  if (sVar2 == 0) {
    return;
  }
  TVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>
  ::TVector((TVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>
             *)&it,tokens);
  local_48._M_current =
       (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
                *)&it);
  while( true ) {
    local_50._M_current =
         (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
                *)&it);
    bVar1 = __gnu_cxx::operator!=(&local_48,&local_50);
    if (!bVar1) break;
    pbVar3 = __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>_>
             ::operator->(&local_48);
    __first = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::begin
                        (pbVar3);
    pbVar3 = __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>_>
             ::operator->(&local_48);
    __last = std::__cxx11::
             basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::end(pbVar3)
    ;
    pbVar3 = __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>_>
             ::operator->(&local_48);
    __result = std::__cxx11::
               basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::begin
                         (pbVar3);
    std::
    transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>,int(*)(int)noexcept>
              ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>
                )__first._M_current,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>
                )__last._M_current,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>
                )__result._M_current,tolower);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>_>
    ::operator++(&local_48);
  }
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
          ::size(&tokens->
                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
                );
  if (sVar2 == 4) {
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
                           *)&it,0);
    bVar1 = std::operator==(pvVar4,"pack_matrix");
    if (bVar1) {
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
               ::operator[](&tokens->
                             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
                            ,1);
      bVar1 = std::operator==(pvVar5,"(");
      if (bVar1) {
        pvVar5 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
                 ::operator[](&tokens->
                               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
                              ,3);
        bVar1 = std::operator==(pvVar5,")");
        if (bVar1) {
          pvVar4 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
                                 *)&it,2);
          bVar1 = std::operator==(pvVar4,"row_major");
          if (bVar1) {
            *(ulong *)&(this->globalBufferDefaults).field_0x8 =
                 *(ulong *)&(this->globalBufferDefaults).field_0x8 & 0x1fffffffffffffff |
                 0x4000000000000000;
            *(ulong *)&(this->globalUniformDefaults).field_0x8 =
                 *(ulong *)&(this->globalUniformDefaults).field_0x8 & 0x1fffffffffffffff |
                 0x4000000000000000;
          }
          else {
            pvVar4 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
                                   *)&it,2);
            bVar1 = std::operator==(pvVar4,"column_major");
            if (bVar1) {
              *(ulong *)&(this->globalBufferDefaults).field_0x8 =
                   *(ulong *)&(this->globalBufferDefaults).field_0x8 & 0x1fffffffffffffff |
                   0x2000000000000000;
              *(ulong *)&(this->globalUniformDefaults).field_0x8 =
                   *(ulong *)&(this->globalUniformDefaults).field_0x8 & 0x1fffffffffffffff |
                   0x2000000000000000;
            }
            else {
              pvVar5 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
                       ::operator[](&tokens->
                                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
                                    ,2);
              pcVar6 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                       c_str(pvVar5);
              (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2e])
                        (this,loc,"unknown pack_matrix pragma value",pcVar6,"");
              *(ulong *)&(this->globalBufferDefaults).field_0x8 =
                   *(ulong *)&(this->globalBufferDefaults).field_0x8 & 0x1fffffffffffffff |
                   0x2000000000000000;
              *(ulong *)&(this->globalUniformDefaults).field_0x8 =
                   *(ulong *)&(this->globalUniformDefaults).field_0x8 & 0x1fffffffffffffff |
                   0x2000000000000000;
            }
          }
          goto LAB_0055afea;
        }
      }
    }
  }
  pvVar4 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
                         *)&it,0);
  bVar1 = std::operator==(pvVar4,"once");
  if (bVar1) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2e])
              (this,loc,"not implemented","#pragma once","");
  }
LAB_0055afea:
  TVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>
  ::~TVector((TVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>
              *)&it);
  return;
}

Assistant:

void HlslParseContext::handlePragma(const TSourceLoc& loc, const TVector<TString>& tokens)
{
    if (pragmaCallback)
        pragmaCallback(loc.line, tokens);

    if (tokens.size() == 0)
        return;

    // These pragmas are case insensitive in HLSL, so we'll compare in lower case.
    TVector<TString> lowerTokens = tokens;

    for (auto it = lowerTokens.begin(); it != lowerTokens.end(); ++it)
        std::transform(it->begin(), it->end(), it->begin(), ::tolower);

    // Handle pack_matrix
    if (tokens.size() == 4 && lowerTokens[0] == "pack_matrix" && tokens[1] == "(" && tokens[3] == ")") {
        // Note that HLSL semantic order is Mrc, not Mcr like SPIR-V, so we reverse the sense.
        // Row major becomes column major and vice versa.

        if (lowerTokens[2] == "row_major") {
            globalUniformDefaults.layoutMatrix = globalBufferDefaults.layoutMatrix = ElmColumnMajor;
        } else if (lowerTokens[2] == "column_major") {
            globalUniformDefaults.layoutMatrix = globalBufferDefaults.layoutMatrix = ElmRowMajor;
        } else {
            // unknown majorness strings are treated as (HLSL column major)==(SPIR-V row major)
            warn(loc, "unknown pack_matrix pragma value", tokens[2].c_str(), "");
            globalUniformDefaults.layoutMatrix = globalBufferDefaults.layoutMatrix = ElmRowMajor;
        }
        return;
    }

    // Handle once
    if (lowerTokens[0] == "once") {
        warn(loc, "not implemented", "#pragma once", "");
        return;
    }
}